

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextRemoveNode
               (ImGuiContext *ctx,ImGuiDockNode *node,bool merge_sibling_into_parent_node)

{
  ImGuiDockNode *pIVar1;
  bool bVar2;
  ImGuiDockNode *local_58;
  int local_4c;
  int n;
  ImGuiDockNode *sibling_node;
  bool merge;
  ImGuiDockNode *parent_node;
  ImGuiDockContext *dc;
  ImGuiContext *g;
  bool merge_sibling_into_parent_node_local;
  ImGuiDockNode *node_local;
  ImGuiContext *ctx_local;
  
  pIVar1 = DockContextFindNodeByID(ctx,node->ID);
  if (pIVar1 != node) {
    __assert_fail("DockContextFindNodeByID(ctx, node->ID) == node",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                  ,0x2eb0,"void ImGui::DockContextRemoveNode(ImGuiContext *, ImGuiDockNode *, bool)"
                 );
  }
  bVar2 = false;
  if (node->ChildNodes[0] == (ImGuiDockNode *)0x0) {
    bVar2 = node->ChildNodes[1] == (ImGuiDockNode *)0x0;
  }
  if (!bVar2) {
    __assert_fail("node->ChildNodes[0] == __null && node->ChildNodes[1] == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                  ,0x2eb1,"void ImGui::DockContextRemoveNode(ImGuiContext *, ImGuiDockNode *, bool)"
                 );
  }
  if ((node->Windows).Size != 0) {
    __assert_fail("node->Windows.Size == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                  ,0x2eb2,"void ImGui::DockContextRemoveNode(ImGuiContext *, ImGuiDockNode *, bool)"
                 );
  }
  if (node->HostWindow != (ImGuiWindow *)0x0) {
    node->HostWindow->DockNodeAsHost = (ImGuiDockNode *)0x0;
  }
  pIVar1 = node->ParentNode;
  if (merge_sibling_into_parent_node && pIVar1 != (ImGuiDockNode *)0x0) {
    bVar2 = true;
    if (pIVar1->ChildNodes[0] != node) {
      bVar2 = pIVar1->ChildNodes[1] == node;
    }
    if (!bVar2) {
      __assert_fail("parent_node->ChildNodes[0] == node || parent_node->ChildNodes[1] == node",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                    ,0x2ebb,
                    "void ImGui::DockContextRemoveNode(ImGuiContext *, ImGuiDockNode *, bool)");
    }
    if (pIVar1->ChildNodes[0] == node) {
      local_58 = pIVar1->ChildNodes[1];
    }
    else {
      local_58 = pIVar1->ChildNodes[0];
    }
    DockNodeTreeMerge(ctx,pIVar1,local_58);
  }
  else {
    for (local_4c = 0; pIVar1 != (ImGuiDockNode *)0x0 && local_4c < 2; local_4c = local_4c + 1) {
      if (pIVar1->ChildNodes[local_4c] == node) {
        node->ParentNode->ChildNodes[local_4c] = (ImGuiDockNode *)0x0;
      }
    }
    ImGuiStorage::SetVoidPtr(&(ctx->DockContext).Nodes,node->ID,(void *)0x0);
    IM_DELETE<ImGuiDockNode>(node);
  }
  return;
}

Assistant:

static void ImGui::DockContextRemoveNode(ImGuiContext* ctx, ImGuiDockNode* node, bool merge_sibling_into_parent_node)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc  = &ctx->DockContext;

    IMGUI_DEBUG_LOG_DOCKING("DockContextRemoveNode 0x%08X\n", node->ID);
    IM_ASSERT(DockContextFindNodeByID(ctx, node->ID) == node);
    IM_ASSERT(node->ChildNodes[0] == NULL && node->ChildNodes[1] == NULL);
    IM_ASSERT(node->Windows.Size == 0);

    if (node->HostWindow)
        node->HostWindow->DockNodeAsHost = NULL;

    ImGuiDockNode* parent_node = node->ParentNode;
    const bool merge = (merge_sibling_into_parent_node && parent_node != NULL);
    if (merge)
    {
        IM_ASSERT(parent_node->ChildNodes[0] == node || parent_node->ChildNodes[1] == node);
        ImGuiDockNode* sibling_node = (parent_node->ChildNodes[0] == node ? parent_node->ChildNodes[1] : parent_node->ChildNodes[0]);
        DockNodeTreeMerge(&g, parent_node, sibling_node);
    }
    else
    {
        for (int n = 0; parent_node && n < IM_ARRAYSIZE(parent_node->ChildNodes); n++)
            if (parent_node->ChildNodes[n] == node)
                node->ParentNode->ChildNodes[n] = NULL;
        dc->Nodes.SetVoidPtr(node->ID, NULL);
        IM_DELETE(node);
    }
}